

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O0

int run_test_sys_error(void)

{
  int iVar1;
  
  iVar1 = uv_translate_sys_error(1);
  if (iVar1 != -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-error.c"
            ,0x48,"uv_translate_sys_error(EPERM) == UV_EPERM");
    abort();
  }
  iVar1 = uv_translate_sys_error(0x20);
  if (iVar1 != -0x20) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-error.c"
            ,0x49,"uv_translate_sys_error(EPIPE) == UV_EPIPE");
    abort();
  }
  iVar1 = uv_translate_sys_error(0x16);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-error.c"
            ,0x4a,"uv_translate_sys_error(EINVAL) == UV_EINVAL");
    abort();
  }
  iVar1 = uv_translate_sys_error(0xffffffea);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-error.c"
            ,0x4c,"uv_translate_sys_error(UV_EINVAL) == UV_EINVAL");
    abort();
  }
  iVar1 = uv_translate_sys_error(0xffffffde);
  if (iVar1 != -0x22) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-error.c"
            ,0x4d,"uv_translate_sys_error(UV_ERANGE) == UV_ERANGE");
    abort();
  }
  iVar1 = uv_translate_sys_error(0xfffffff3);
  if (iVar1 != -0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-error.c"
            ,0x4e,"uv_translate_sys_error(UV_EACCES) == UV_EACCES");
    abort();
  }
  iVar1 = uv_translate_sys_error(0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-error.c"
            ,0x4f,"uv_translate_sys_error(0) == 0");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(sys_error) {
#if defined(_WIN32)
  ASSERT(uv_translate_sys_error(ERROR_NOACCESS) == UV_EACCES);
  ASSERT(uv_translate_sys_error(ERROR_ELEVATION_REQUIRED) == UV_EACCES);
  ASSERT(uv_translate_sys_error(WSAEADDRINUSE) == UV_EADDRINUSE);
  ASSERT(uv_translate_sys_error(ERROR_BAD_PIPE) == UV_EPIPE);
#else
  ASSERT(uv_translate_sys_error(EPERM) == UV_EPERM);
  ASSERT(uv_translate_sys_error(EPIPE) == UV_EPIPE);
  ASSERT(uv_translate_sys_error(EINVAL) == UV_EINVAL);
#endif
  ASSERT(uv_translate_sys_error(UV_EINVAL) == UV_EINVAL);
  ASSERT(uv_translate_sys_error(UV_ERANGE) == UV_ERANGE);
  ASSERT(uv_translate_sys_error(UV_EACCES) == UV_EACCES);
  ASSERT(uv_translate_sys_error(0) == 0);

  return 0;
}